

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MemPool.cpp
# Opt level: O3

void amrex_array_init_snan(Real *p,size_t nelems)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  auVar2 = _DAT_0074fb40;
  auVar1 = _DAT_0074fb30;
  if (nelems != 0) {
    lVar4 = nelems - 1;
    auVar5._8_4_ = (int)lVar4;
    auVar5._0_8_ = lVar4;
    auVar5._12_4_ = (int)((ulong)lVar4 >> 0x20);
    uVar3 = 0;
    auVar5 = auVar5 ^ _DAT_0074fb40;
    do {
      auVar6._8_4_ = (int)uVar3;
      auVar6._0_8_ = uVar3;
      auVar6._12_4_ = (int)(uVar3 >> 0x20);
      auVar6 = (auVar6 | auVar1) ^ auVar2;
      if ((bool)(~(auVar6._4_4_ == auVar5._4_4_ && auVar5._0_4_ < auVar6._0_4_ ||
                  auVar5._4_4_ < auVar6._4_4_) & 1)) {
        p[uVar3] = NAN;
      }
      if ((auVar6._12_4_ != auVar5._12_4_ || auVar6._8_4_ <= auVar5._8_4_) &&
          auVar6._12_4_ <= auVar5._12_4_) {
        p[uVar3 + 1] = NAN;
      }
      uVar3 = uVar3 + 2;
    } while ((nelems + 1 & 0xfffffffffffffffe) != uVar3);
  }
  return;
}

Assistant:

void amrex_array_init_snan (Real* p, size_t nelems)
{
#ifdef BL_USE_DOUBLE

#ifdef UINT64_MAX
    const uint64_t snan = UINT64_C(0x7ff0000080000001);
    static_assert(sizeof(double) == sizeof(uint64_t), "MemPool: sizeof double != sizeof uint64_t");
    for (size_t i = 0; i < nelems; ++i) {
        std::memcpy(p++, &snan, sizeof(double));
    }
#endif

#else

#ifdef UINT32_MAX
    const uint32_t snan = UINT32_C(0x7fa00000);
    static_assert(sizeof(float) == sizeof(uint32_t), "MemPool: sizeof float != sizeof uint32_t");
    for (size_t i = 0; i < nelems; ++i) {
        std::memcpy(p++, &snan, sizeof(float));
    }
#endif

#endif
}